

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O3

int __thiscall re2::Bitmap256::FindNextSetBit(Bitmap256 *this,int c)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (c < 0) {
    __assert_fail("(c) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/bitmap256.h"
                  ,0x56,"int re2::Bitmap256::FindNextSetBit(int) const");
  }
  if (0xff < (uint)c) {
    __assert_fail("(c) <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/bitmap256.h"
                  ,0x57,"int re2::Bitmap256::FindNextSetBit(int) const");
  }
  uVar2 = (uint)c >> 6;
  uVar4 = (this->words_[uVar2] >> ((byte)c & 0x3f)) << ((byte)c & 0x3f);
  if (uVar4 != 0) {
    lVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    return (uint)lVar1 | c & 0xc0U;
  }
  uVar3 = 0xffffffff;
  if (uVar2 != 2) {
    if (uVar2 != 1) {
      if (uVar2 != 0) {
        return -1;
      }
      uVar4 = this->words_[1];
      if (uVar4 != 0) {
        lVar1 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        return (uint)lVar1 | 0x40;
      }
    }
    uVar4 = this->words_[2];
    if (uVar4 != 0) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      return (uint)lVar1 | 0x80;
    }
  }
  uVar4 = this->words_[3];
  if (uVar4 != 0) {
    lVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar3 = (uint)lVar1 | 0xc0;
  }
  return uVar3;
}

Assistant:

int Bitmap256::FindNextSetBit(int c) const {
  DCHECK_GE(c, 0);
  DCHECK_LE(c, 255);

  // Check the word that contains the bit. Mask out any lower bits.
  int i = c / 64;
  uint64_t word = words_[i] & (~uint64_t{0} << (c % 64));
  if (word != 0)
    return (i * 64) + FindLSBSet(word);

  // Check any following words.
  i++;
  switch (i) {
    case 1:
      if (words_[1] != 0)
        return (1 * 64) + FindLSBSet(words_[1]);
      FALLTHROUGH_INTENDED;
    case 2:
      if (words_[2] != 0)
        return (2 * 64) + FindLSBSet(words_[2]);
      FALLTHROUGH_INTENDED;
    case 3:
      if (words_[3] != 0)
        return (3 * 64) + FindLSBSet(words_[3]);
      FALLTHROUGH_INTENDED;
    default:
      return -1;
  }
}